

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

ostream * pstore::operator<<(ostream *stream,version_type version)

{
  ostream *poVar1;
  char *local_20;
  char *str;
  version_type version_local;
  ostream *stream_local;
  
  local_20 = "";
  switch(version) {
  case time_based:
    local_20 = "time_based";
    break;
  case dce_security:
    local_20 = "dce_security";
    break;
  case name_based_md5:
    local_20 = "name_based_md5";
    break;
  case random_number_based:
    local_20 = "random_number_based";
    break;
  case name_based_sha1:
    local_20 = "name_based_sha1";
    break;
  case unknown:
    local_20 = "unknown";
  }
  poVar1 = std::operator<<(stream,local_20);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & stream, uuid::version_type const version) {
        char const * str = "";
        switch (version) {
        case uuid::version_type::time_based: str = "time_based"; break;
        case uuid::version_type::dce_security: str = "dce_security"; break;
        case uuid::version_type::name_based_md5: str = "name_based_md5"; break;
        case uuid::version_type::random_number_based: str = "random_number_based"; break;
        case uuid::version_type::name_based_sha1: str = "name_based_sha1"; break;
        case uuid::version_type::unknown: str = "unknown"; break;
        }
        return stream << str;
    }